

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O0

void pzshape::TPZShapeTetra::ShapeGenerating
               (TPZVec<double> *pt,TPZVec<int> *nshape,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int iVar12;
  int *piVar13;
  double *pdVar14;
  TPZVec<int> *in_RSI;
  double dVar15;
  double dVar16;
  size_t in_stack_00000108;
  char *in_stack_00000110;
  int xj;
  int is3;
  int is2_1;
  int is1_1;
  int is2;
  int is1;
  int nsnodes;
  int is;
  REAL mult [15];
  int in_stack_fffffffffffffcec;
  double in_stack_fffffffffffffcf0;
  double in_stack_fffffffffffffd00;
  double in_stack_fffffffffffffd08;
  TPZFMatrix<double> *in_stack_fffffffffffffd10;
  int local_b8;
  int local_9c;
  double local_98 [17];
  TPZVec<int> *local_10;
  
  local_10 = in_RSI;
  memcpy(local_98,&DAT_02098120,0x78);
  for (local_9c = 4; local_9c < 0xf; local_9c = local_9c + 1) {
    piVar13 = TPZVec<int>::operator[](local_10,(long)(local_9c + -4));
    if (0 < *piVar13) {
      iVar12 = pztopology::TPZTetrahedron::NSideNodes(local_9c);
      if (iVar12 == 2) {
        pztopology::TPZTetrahedron::SideNodeLocId
                  (SUB84(in_stack_fffffffffffffcf0,0),in_stack_fffffffffffffcec);
        pztopology::TPZTetrahedron::SideNodeLocId
                  (SUB84(in_stack_fffffffffffffcf0,0),in_stack_fffffffffffffcec);
        dVar1 = local_98[local_9c];
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar2 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar3 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        *pdVar14 = dVar1 * dVar2 * dVar3;
        dVar1 = local_98[local_9c];
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar2 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar3 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar4 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar5 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        *pdVar14 = dVar1 * (dVar2 * dVar3 + dVar4 * dVar5);
        dVar1 = local_98[local_9c];
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar2 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar3 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar4 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar5 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        *pdVar14 = dVar1 * (dVar2 * dVar3 + dVar4 * dVar5);
        dVar1 = local_98[local_9c];
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar2 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar3 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar4 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar5 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        *pdVar14 = dVar1 * (dVar2 * dVar3 + dVar4 * dVar5);
      }
      else if (iVar12 == 3) {
        pztopology::TPZTetrahedron::SideNodeLocId
                  (SUB84(in_stack_fffffffffffffcf0,0),in_stack_fffffffffffffcec);
        pztopology::TPZTetrahedron::SideNodeLocId
                  (SUB84(in_stack_fffffffffffffcf0,0),in_stack_fffffffffffffcec);
        pztopology::TPZTetrahedron::SideNodeLocId
                  (SUB84(in_stack_fffffffffffffcf0,0),in_stack_fffffffffffffcec);
        dVar1 = local_98[local_9c];
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar2 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar3 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar4 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        *pdVar14 = dVar1 * dVar2 * dVar3 * dVar4;
        dVar1 = local_98[local_9c];
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar2 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar3 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar4 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar5 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar6 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar7 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar8 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar9 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar10 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        *pdVar14 = dVar1 * (dVar8 * dVar9 * dVar10 + dVar2 * dVar3 * dVar4 + dVar5 * dVar6 * dVar7);
        dVar1 = local_98[local_9c];
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar2 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar3 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar4 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar5 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar6 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar7 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar8 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar9 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar10 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        *pdVar14 = dVar1 * (dVar8 * dVar9 * dVar10 + dVar2 * dVar3 * dVar4 + dVar5 * dVar6 * dVar7);
        dVar1 = local_98[local_9c];
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar2 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar3 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar4 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar5 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar6 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar7 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar8 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar9 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar10 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        *pdVar14 = dVar1 * (dVar8 * dVar9 * dVar10 + dVar2 * dVar3 * dVar4 + dVar5 * dVar6 * dVar7);
      }
      else if (iVar12 == 4) {
        dVar1 = local_98[local_9c];
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar2 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar3 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar4 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        dVar5 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                             (int64_t)in_stack_fffffffffffffd00);
        *pdVar14 = dVar1 * dVar2 * dVar3 * dVar4 * dVar5;
        for (local_b8 = 0; local_b8 < 3; local_b8 = local_b8 + 1) {
          dVar1 = local_98[local_9c];
          pdVar14 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                               (int64_t)in_stack_fffffffffffffd00);
          in_stack_fffffffffffffcf0 = *pdVar14;
          pdVar14 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                               (int64_t)in_stack_fffffffffffffd00);
          dVar15 = in_stack_fffffffffffffcf0 * *pdVar14;
          pdVar14 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                               (int64_t)in_stack_fffffffffffffd00);
          dVar2 = *pdVar14;
          pdVar14 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                               (int64_t)in_stack_fffffffffffffd00);
          dVar3 = *pdVar14;
          pdVar14 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                               (int64_t)in_stack_fffffffffffffd00);
          in_stack_fffffffffffffd00 = *pdVar14;
          pdVar14 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                               (int64_t)in_stack_fffffffffffffd00);
          in_stack_fffffffffffffd08 = in_stack_fffffffffffffd00 * *pdVar14;
          pdVar14 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                               (int64_t)in_stack_fffffffffffffd00);
          in_stack_fffffffffffffd10 = (TPZFMatrix<double> *)(in_stack_fffffffffffffd08 * *pdVar14);
          pdVar14 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                               (int64_t)in_stack_fffffffffffffd00);
          dVar16 = (double)in_stack_fffffffffffffd10 * *pdVar14;
          pdVar14 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                               (int64_t)in_stack_fffffffffffffd00);
          dVar4 = *pdVar14;
          pdVar14 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                               (int64_t)in_stack_fffffffffffffd00);
          dVar5 = *pdVar14;
          pdVar14 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                               (int64_t)in_stack_fffffffffffffd00);
          dVar6 = *pdVar14;
          pdVar14 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                               (int64_t)in_stack_fffffffffffffd00);
          dVar7 = *pdVar14;
          pdVar14 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                               (int64_t)in_stack_fffffffffffffd00);
          dVar8 = *pdVar14;
          pdVar14 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                               (int64_t)in_stack_fffffffffffffd00);
          dVar9 = *pdVar14;
          pdVar14 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                               (int64_t)in_stack_fffffffffffffd00);
          dVar10 = *pdVar14;
          pdVar14 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                               (int64_t)in_stack_fffffffffffffd00);
          dVar11 = *pdVar14;
          pdVar14 = TPZFMatrix<double>::operator()
                              (in_stack_fffffffffffffd10,(int64_t)in_stack_fffffffffffffd08,
                               (int64_t)in_stack_fffffffffffffd00);
          *pdVar14 = dVar1 * (dVar8 * dVar9 * dVar10 * dVar11 +
                             dVar4 * dVar5 * dVar6 * dVar7 + dVar15 * dVar2 * dVar3 + dVar16);
        }
      }
      else {
        pzinternal::DebugStopImpl(in_stack_00000110,in_stack_00000108);
      }
    }
  }
  return;
}

Assistant:

void TPZShapeTetra::ShapeGenerating(const TPZVec<REAL> &pt, TPZVec<int> &nshape, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
{
    REAL mult[] = {1.,1.,1.,1.,4.,4.,4.,4.,4.,4.,27.,27.,27.,27.,54.};

    // 6 ribs
    for(int is=4; is<NSides; is++)
    {
        if(nshape[is-4] < 1) continue;
        int nsnodes = NSideNodes(is);
        switch(nsnodes)
        {
            case 2:
            {
                int is1 = SideNodeLocId(is,0);
                int is2 = SideNodeLocId(is,1);
                phi(is,0) = mult[is]*phi(is1,0)*phi(is2,0);
                dphi(0,is) = mult[is]*(dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2));
                dphi(1,is) = mult[is]*(dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2));
                dphi(2,is) = mult[is]*(dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2));
            }
                break;
            case 3:
            {
                //int face = is-10;
                int is1 = SideNodeLocId(is,0); //ShapeFaceId[face][0];
                int is2 = SideNodeLocId(is,1); //ShapeFaceId[face][1];
                int is3 = SideNodeLocId(is,2); //ShapeFaceId[face][2];
                phi(is,0) = mult[is]*phi(is1,0)*phi(is2,0)*phi(is3,0);
                dphi(0,is) = mult[is]*(dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3));
                dphi(1,is) = mult[is]*(dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3));
                dphi(2,is) = mult[is]*(dphi(2,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(2,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(2,is3));
            }
                break;
            case 4:
            {
                phi(is,0) = mult[is]*phi(0,0)*phi(1,0)*phi(2,0)*phi(3,0);
                for(int xj=0;xj<3;xj++) {
                    dphi(xj,is) = mult[is]*(dphi(xj,0)* phi(1 ,0)* phi(2 ,0)* phi(3 ,0) +
                    phi(0, 0)*dphi(xj,1)* phi(2 ,0)* phi(3 ,0) +
                    phi(0, 0)* phi(1 ,0)*dphi(xj,2)* phi(3 ,0) +
                    phi(0, 0)* phi(1 ,0)* phi(2 ,0)*dphi(xj,3));
                }
            }
                break;
                
            default:
                DebugStop();
        }
    }     
}